

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

size_t wasm::anon_unknown_0::shapeHash(HeapType a)

{
  bool bVar1;
  Struct *a_00;
  size_t sVar2;
  Signature SVar3;
  Type local_48;
  int local_34;
  Array local_30;
  int local_20 [2];
  size_t local_18;
  size_t digest;
  HeapType a_local;
  
  digest = a.id;
  bVar1 = HeapType::isStruct((HeapType *)&digest);
  if (bVar1) {
    local_20[1] = 0;
    local_18 = hash<int>(local_20 + 1);
    a_00 = HeapType::getStruct((HeapType *)&digest);
    sVar2 = shapeHash(a_00);
    hash_combine(&local_18,sVar2);
  }
  else {
    bVar1 = HeapType::isArray((HeapType *)&digest);
    if (bVar1) {
      local_20[0] = 1;
      local_18 = hash<int>(local_20);
      HeapType::getArray((HeapType *)&local_30);
      sVar2 = shapeHash(&local_30);
      hash_combine(&local_18,sVar2);
    }
    else {
      bVar1 = HeapType::isSignature((HeapType *)&digest);
      if (!bVar1) {
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeMerging.cpp"
                           ,0x1ee);
      }
      local_34 = 2;
      local_18 = hash<int>(&local_34);
      SVar3 = HeapType::getSignature((HeapType *)&digest);
      local_48 = SVar3.params.id;
      SVar3.params.id = SVar3.results.id;
      sVar2 = shapeHash((anon_unknown_0 *)local_48.id,SVar3);
      hash_combine(&local_18,sVar2);
    }
  }
  return local_18;
}

Assistant:

size_t shapeHash(HeapType a) {
  size_t digest;
  if (a.isStruct()) {
    digest = hash(0);
    hash_combine(digest, shapeHash(a.getStruct()));
  } else if (a.isArray()) {
    digest = hash(1);
    hash_combine(digest, shapeHash(a.getArray()));
  } else if (a.isSignature()) {
    digest = hash(2);
    hash_combine(digest, shapeHash(a.getSignature()));
  } else {
    WASM_UNREACHABLE("unexpected kind");
  }
  return digest;
}